

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

SimpleString __thiscall SimpleString::operator+(SimpleString *this,SimpleString *rhs)

{
  undefined8 *in_RDX;
  size_t extraout_RDX;
  SimpleString SVar1;
  
  SimpleString(this,rhs->buffer_);
  operator+=(this,(char *)*in_RDX);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)this;
  return SVar1;
}

Assistant:

SimpleString SimpleString::operator+(const SimpleString& rhs) const
{
    SimpleString t(getBuffer());
    t += rhs.getBuffer();
    return t;
}